

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManDupUnshuffleInputs(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  iVar1 = Gia_ManIsSeqWithBoxes(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsSeqWithBoxes(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xd2,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  iVar2 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
  if (iVar2 != p->vCis->nSize) {
    __assert_fail("nAll == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xde,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  iVar1 = iVar1 - p->nRegs;
  if (iVar1 < 1) {
    __assert_fail("nPis > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0xdf,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,iVar6);
    pGVar5->Value = uVar3;
  }
  for (iVar6 = iVar2 - p->nRegs; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,iVar6);
    pGVar5->Value = uVar3;
  }
  for (; iVar1 < iVar2 - p->nRegs; iVar1 = iVar1 + 1) {
    uVar3 = Gia_ManAppendCi(p_00);
    pGVar5 = Gia_ManCi(p,iVar1);
    pGVar5->Value = uVar3;
  }
  puts("Warning: Unshuffled CI order to be correct AIG with boxes.");
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar6 = Gia_ObjFanin1Copy(pGVar5);
      uVar3 = Gia_ManAppendAnd(p_00,iVar2,iVar6);
      pGVar5->Value = uVar3;
    }
  }
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCo(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar3 = Gia_ManAppendCo(p_00,iVar2);
    pGVar5->Value = uVar3;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  iVar1 = Gia_ManIsNormalized(p_00);
  if (iVar1 != 0) {
    Gia_ManDupRemapEquiv(p_00,p);
    return p_00;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0xf1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupUnshuffleInputs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nCIs, nAll, nPis;
    // sanity checks
    assert( Gia_ManIsNormalized(p) );
    assert( Gia_ManIsSeqWithBoxes(p) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    // change input order
    // desired reorder:   PIs + NewCIs + FOs
    // current CI order:  PIs + FOs + NewCIs
    nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
    nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
    nPis = nCIs - Gia_ManRegNum(p);
    assert( nAll == Gia_ManCiNum(p) );
    assert( nPis > 0 );
    // copy PIs first
    for ( i = 0; i < nPis; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy flops second
    for ( i = nAll - Gia_ManRegNum(p); i < nAll; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy new CIs last
    for ( i = nPis; i < nAll - Gia_ManRegNum(p); i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    printf( "Warning: Unshuffled CI order to be correct AIG with boxes.\n" );
    // other things
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}